

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O2

void __thiscall
bloaty::RangeMapTest_UnknownSize3_Test::RangeMapTest_UnknownSize3_Test
          (RangeMapTest_UnknownSize3_Test *this)

{
  RangeMapTest::RangeMapTest(&this->super_RangeMapTest);
  (this->super_RangeMapTest).super_Test._vptr_Test = (_func_int **)&PTR__RangeMapTest_005fca78;
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize3) {
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(150, kUnknownSize, "bar");
  // This tells us the ultimate size of "foo", and we keep the "foo" label even
  // though the new label is "baz".
  map_.AddRange(100, 100, "baz");
  AssertMainMapEquals({
    {100, 150, kNoTranslation, "foo"},
    {150, 200, kNoTranslation, "bar"},
  });
}